

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qduplicatetracker_p.h
# Opt level: O2

void __thiscall
QDuplicateTracker<RowOrColumnDefinition,_32UL>::QDuplicateTracker
          (QDuplicateTracker<RowOrColumnDefinition,_32UL> *this)

{
  long in_FS_OFFSET;
  allocator_type local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::pmr::monotonic_buffer_resource::monotonic_buffer_resource(&this->res,this,0x700);
  local_20._M_resource = (memory_resource *)&this->res;
  std::
  unordered_set<RowOrColumnDefinition,_QDuplicateTracker<RowOrColumnDefinition,_32UL>::QHasher<RowOrColumnDefinition>,_std::equal_to<RowOrColumnDefinition>,_std::pmr::polymorphic_allocator<RowOrColumnDefinition>_>
  ::unordered_set(&this->set,0x20,&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit QDuplicateTracker(qsizetype n)
#ifdef __cpp_lib_memory_resource
        : set{size_t(n), &res}
#else
        : set{n}
#endif
    {}